

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constexpr_parser.h
# Opt level: O0

char * absl::lts_20240722::str_format_internal::ConsumeConversion<false>
                 (char *pos,char *end,UnboundConversion *conv,int *next_arg)

{
  bool bVar1;
  Flags b;
  Flags FVar2;
  LengthMod LVar3;
  FormatConversionChar FVar4;
  int iVar5;
  char *pcVar6;
  uint8_t *puVar7;
  ConvTag local_41;
  int local_40;
  LengthMod length_mod;
  ConvTag tag;
  int maybe_width;
  ConvTag tag_1;
  char c;
  char *original_pos;
  int *next_arg_local;
  UnboundConversion *conv_local;
  char *end_local;
  char *pos_local;
  
  if (pos == end) {
    return (char *)0x0;
  }
  end_local = pos + 1;
  tag.tag_ = *pos;
  if (conv->flags != kBasic) {
    __assert_fail("conv->flags == Flags::kBasic",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/absl-src/absl/strings/internal/str_format/constexpr_parser.h"
                  ,0xee,
                  "const char *absl::str_format_internal::ConsumeConversion(const char *, const char *const, UnboundConversion *, int *) [is_positional = false]"
                 );
  }
  if ((char)tag.tag_ < 'A') {
    while ((char)tag.tag_ < '1') {
      length_mod = (LengthMod)GetTagForChar(tag.tag_);
      bVar1 = ConvTag::is_flags((ConvTag *)&length_mod);
      if (!bVar1) break;
      FVar2 = conv->flags;
      b = ConvTag::as_flags((ConvTag *)&length_mod);
      FVar2 = operator|(FVar2,b);
      conv->flags = FVar2;
      if (end_local == end) {
        return (char *)0x0;
      }
      tag.tag_ = *end_local;
      end_local = end_local + 1;
    }
    if ((char)tag.tag_ < ':') {
      if ((char)tag.tag_ < '0') {
        if (tag.tag_ == '*') {
          FVar2 = operator|(conv->flags,kNonBasic);
          conv->flags = FVar2;
          if (end_local == end) {
            return (char *)0x0;
          }
          tag.tag_ = *end_local;
          iVar5 = *next_arg;
          *next_arg = iVar5 + 1;
          end_local = end_local + 1;
          UnboundConversion::InputValue::set_from_arg(&conv->width,iVar5 + 1);
        }
      }
      else {
        local_40 = ParseDigits((char *)&tag,&end_local,end);
        if (tag.tag_ == '$') {
          if (*next_arg != 0) {
            return (char *)0x0;
          }
          *next_arg = -1;
          pcVar6 = ConsumeConversion<true>(pos,end,conv,next_arg);
          return pcVar6;
        }
        FVar2 = operator|(conv->flags,kNonBasic);
        conv->flags = FVar2;
        UnboundConversion::InputValue::set_value(&conv->width,local_40);
      }
    }
    if (tag.tag_ == '.') {
      FVar2 = operator|(conv->flags,kNonBasic);
      conv->flags = FVar2;
      if (end_local == end) {
        return (char *)0x0;
      }
      puVar7 = (uint8_t *)(end_local + 1);
      tag.tag_ = *end_local;
      if (((char)tag.tag_ < '0') || ('9' < (char)tag.tag_)) {
        if (tag.tag_ == '*') {
          if (puVar7 == (uint8_t *)end) {
            return (char *)0x0;
          }
          end_local = end_local + 2;
          tag.tag_ = *puVar7;
          iVar5 = *next_arg;
          *next_arg = iVar5 + 1;
          UnboundConversion::InputValue::set_from_arg(&conv->precision,iVar5 + 1);
        }
        else {
          end_local = (char *)puVar7;
          UnboundConversion::InputValue::set_value(&conv->precision,0);
        }
      }
      else {
        end_local = (char *)puVar7;
        iVar5 = ParseDigits((char *)&tag,&end_local,end);
        UnboundConversion::InputValue::set_value(&conv->precision,iVar5);
      }
    }
  }
  local_41 = GetTagForChar(tag.tag_);
  bVar1 = false;
  if (tag.tag_ == 'v') {
    bVar1 = conv->flags != kBasic;
  }
  if (bVar1) {
    return (char *)0x0;
  }
  bVar1 = ConvTag::is_conv(&local_41);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    bVar1 = ConvTag::is_length(&local_41);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      return (char *)0x0;
    }
    LVar3 = ConvTag::as_length(&local_41);
    if (end_local == end) {
      return (char *)0x0;
    }
    puVar7 = (uint8_t *)(end_local + 1);
    tag.tag_ = *end_local;
    if ((tag.tag_ == 'h') && (LVar3 == h)) {
      conv->length_mod = hh;
      if (puVar7 == (uint8_t *)end) {
        return (char *)0x0;
      }
      tag.tag_ = *puVar7;
      end_local = end_local + 2;
    }
    else if ((tag.tag_ == 'l') && (LVar3 == l)) {
      conv->length_mod = ll;
      if (puVar7 == (uint8_t *)end) {
        return (char *)0x0;
      }
      tag.tag_ = *puVar7;
      end_local = end_local + 2;
    }
    else {
      conv->length_mod = LVar3;
      end_local = (char *)puVar7;
    }
    local_41 = GetTagForChar(tag.tag_);
    if (tag.tag_ == 'v') {
      return (char *)0x0;
    }
    bVar1 = ConvTag::is_conv(&local_41);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      return (char *)0x0;
    }
    if ((conv->length_mod == l) && (tag.tag_ == 'c')) {
      FVar2 = operator|(conv->flags,kNonBasic);
      conv->flags = FVar2;
    }
  }
  bVar1 = CheckFastPathSetting(conv);
  if (bVar1) {
    FVar4 = ConvTag::as_conv(&local_41);
    conv->conv = FVar4;
    iVar5 = *next_arg;
    *next_arg = iVar5 + 1;
    conv->arg_position = iVar5 + 1;
    return end_local;
  }
  __assert_fail("CheckFastPathSetting(*conv)",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/absl-src/absl/strings/internal/str_format/constexpr_parser.h"
                ,0x14d,
                "const char *absl::str_format_internal::ConsumeConversion(const char *, const char *const, UnboundConversion *, int *) [is_positional = false]"
               );
}

Assistant:

constexpr const char* ConsumeConversion(const char* pos, const char* const end,
                                        UnboundConversion* conv,
                                        int* next_arg) {
  const char* const original_pos = pos;
  char c = 0;
  // Read the next char into `c` and update `pos`. Returns false if there are
  // no more chars to read.
#define ABSL_FORMAT_PARSER_INTERNAL_GET_CHAR()          \
  do {                                                  \
    if (ABSL_PREDICT_FALSE(pos == end)) return nullptr; \
    c = *pos++;                                         \
  } while (0)

  if (is_positional) {
    ABSL_FORMAT_PARSER_INTERNAL_GET_CHAR();
    if (ABSL_PREDICT_FALSE(c < '1' || c > '9')) return nullptr;
    conv->arg_position = ParseDigits(c, pos, end);
    assert(conv->arg_position > 0);
    if (ABSL_PREDICT_FALSE(c != '$')) return nullptr;
  }

  ABSL_FORMAT_PARSER_INTERNAL_GET_CHAR();

  // We should start with the basic flag on.
  assert(conv->flags == Flags::kBasic);

  // Any non alpha character makes this conversion not basic.
  // This includes flags (-+ #0), width (1-9, *) or precision (.).
  // All conversion characters and length modifiers are alpha characters.
  if (c < 'A') {
    while (c <= '0') {
      auto tag = GetTagForChar(c);
      if (tag.is_flags()) {
        conv->flags = conv->flags | tag.as_flags();
        ABSL_FORMAT_PARSER_INTERNAL_GET_CHAR();
      } else {
        break;
      }
    }

    if (c <= '9') {
      if (c >= '0') {
        int maybe_width = ParseDigits(c, pos, end);
        if (!is_positional && c == '$') {
          if (ABSL_PREDICT_FALSE(*next_arg != 0)) return nullptr;
          // Positional conversion.
          *next_arg = -1;
          return ConsumeConversion<true>(original_pos, end, conv, next_arg);
        }
        conv->flags = conv->flags | Flags::kNonBasic;
        conv->width.set_value(maybe_width);
      } else if (c == '*') {
        conv->flags = conv->flags | Flags::kNonBasic;
        ABSL_FORMAT_PARSER_INTERNAL_GET_CHAR();
        if (is_positional) {
          if (ABSL_PREDICT_FALSE(c < '1' || c > '9')) return nullptr;
          conv->width.set_from_arg(ParseDigits(c, pos, end));
          if (ABSL_PREDICT_FALSE(c != '$')) return nullptr;
          ABSL_FORMAT_PARSER_INTERNAL_GET_CHAR();
        } else {
          conv->width.set_from_arg(++*next_arg);
        }
      }
    }

    if (c == '.') {
      conv->flags = conv->flags | Flags::kNonBasic;
      ABSL_FORMAT_PARSER_INTERNAL_GET_CHAR();
      if ('0' <= c && c <= '9') {
        conv->precision.set_value(ParseDigits(c, pos, end));
      } else if (c == '*') {
        ABSL_FORMAT_PARSER_INTERNAL_GET_CHAR();
        if (is_positional) {
          if (ABSL_PREDICT_FALSE(c < '1' || c > '9')) return nullptr;
          conv->precision.set_from_arg(ParseDigits(c, pos, end));
          if (c != '$') return nullptr;
          ABSL_FORMAT_PARSER_INTERNAL_GET_CHAR();
        } else {
          conv->precision.set_from_arg(++*next_arg);
        }
      } else {
        conv->precision.set_value(0);
      }
    }
  }

  auto tag = GetTagForChar(c);

  if (ABSL_PREDICT_FALSE(c == 'v' && conv->flags != Flags::kBasic)) {
    return nullptr;
  }

  if (ABSL_PREDICT_FALSE(!tag.is_conv())) {
    if (ABSL_PREDICT_FALSE(!tag.is_length())) return nullptr;

    // It is a length modifier.
    LengthMod length_mod = tag.as_length();
    ABSL_FORMAT_PARSER_INTERNAL_GET_CHAR();
    if (c == 'h' && length_mod == LengthMod::h) {
      conv->length_mod = LengthMod::hh;
      ABSL_FORMAT_PARSER_INTERNAL_GET_CHAR();
    } else if (c == 'l' && length_mod == LengthMod::l) {
      conv->length_mod = LengthMod::ll;
      ABSL_FORMAT_PARSER_INTERNAL_GET_CHAR();
    } else {
      conv->length_mod = length_mod;
    }
    tag = GetTagForChar(c);

    if (ABSL_PREDICT_FALSE(c == 'v')) return nullptr;
    if (ABSL_PREDICT_FALSE(!tag.is_conv())) return nullptr;

    // `wchar_t` args are marked non-basic so `Bind()` will copy the length mod.
    if (conv->length_mod == LengthMod::l && c == 'c') {
      conv->flags = conv->flags | Flags::kNonBasic;
    }
  }
#undef ABSL_FORMAT_PARSER_INTERNAL_GET_CHAR

  assert(CheckFastPathSetting(*conv));
  (void)(&CheckFastPathSetting);

  conv->conv = tag.as_conv();
  if (!is_positional) conv->arg_position = ++*next_arg;
  return pos;
}